

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pca.cpp
# Opt level: O3

Vector __thiscall PCA::tc(PCA *this,Vector *f,Matrix *eigen)

{
  uint uVar1;
  long lVar2;
  double *pdVar3;
  long lVar4;
  long lVar5;
  double *pdVar6;
  long lVar7;
  long *in_RCX;
  ulong uVar8;
  long extraout_RDX;
  long lVar9;
  long lVar10;
  uint uVar11;
  double *pdVar12;
  long lVar13;
  double dVar14;
  Vector VVar15;
  
  *(undefined8 *)this = 0;
  (this->covarianza).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
  m_data = (double *)0x0;
  uVar8 = (ulong)*(uint *)&(f->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                           m_storage.m_data;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
            ((DenseStorage<double,__1,__1,_1,_0> *)this,uVar8,uVar8,1);
  uVar1 = *(uint *)&(f->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                    m_data;
  lVar9 = extraout_RDX;
  if (uVar1 != 0) {
    lVar2 = *in_RCX;
    lVar9 = in_RCX[1];
    if (lVar2 != 0 && lVar9 < 0) {
      __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ilanolkies[P]metnum-tp2/eigen/Eigen/src/Core/MapBase.h"
                    ,0xb0,
                    "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>, Level = 0]"
                   );
    }
    pdVar3 = (eigen->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.
             m_data;
    lVar4 = (eigen->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.
            m_rows;
    lVar5 = *(long *)this;
    pdVar6 = (this->covarianza).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
             m_storage.m_data;
    uVar11 = 0;
    lVar10 = lVar2;
    do {
      uVar8 = (ulong)uVar11;
      lVar7 = in_RCX[2];
      if (lVar7 <= (long)uVar8) {
        __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ilanolkies[P]metnum-tp2/eigen/Eigen/src/Core/Block.h"
                      ,0x7a,
                      "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                     );
      }
      if (lVar9 != lVar4) {
        __assert_fail("size() == other.size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ilanolkies[P]metnum-tp2/eigen/Eigen/src/Core/Dot.h"
                      ,0x52,
                      "typename ScalarBinaryOpTraits<typename internal::traits<Derived>::Scalar, typename internal::traits<OtherDerived>::Scalar>::ReturnType Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>>::dot(const MatrixBase<OtherDerived> &) const [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>, OtherDerived = Eigen::Matrix<double, -1, 1>]"
                     );
      }
      if (lVar9 == 0) {
        dVar14 = 0.0;
      }
      else {
        if (lVar9 < 1) {
          __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ilanolkies[P]metnum-tp2/eigen/Eigen/src/Core/Redux.h"
                        ,0x19b,
                        "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>, const Eigen::Matrix<double, -1, 1>>>::redux(const Func &) const [Derived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>, const Eigen::Matrix<double, -1, 1>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
                       );
        }
        dVar14 = *(double *)(lVar2 + uVar8 * 8) * *pdVar3;
        if (lVar9 != 1) {
          pdVar12 = (double *)(lVar10 + lVar7 * 8);
          lVar13 = 1;
          do {
            dVar14 = dVar14 + *pdVar12 * pdVar3[lVar13];
            lVar13 = lVar13 + 1;
            pdVar12 = pdVar12 + lVar7;
          } while (lVar9 != lVar13);
        }
      }
      if ((long)pdVar6 <= (long)uVar8) {
        __assert_fail("index >= 0 && index < size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ilanolkies[P]metnum-tp2/eigen/Eigen/src/Core/DenseCoeffsBase.h"
                      ,0x1ab,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                     );
      }
      *(double *)(lVar5 + uVar8 * 8) = dVar14;
      uVar11 = uVar11 + 1;
      lVar10 = lVar10 + 8;
    } while (uVar11 != uVar1);
  }
  VVar15.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = lVar9;
  VVar15.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (Vector)VVar15.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Vector PCA::tc(Vector &f, Matrix &eigen) {
	Vector res = Vector(alpha);

	for(unsigned int i = 0; i < alpha; i++)
		res(i) = eigen.col(i).dot(f);

	return res;
}